

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpSearchAsync(UpnpClient_Handle Hnd,int Mx,char *Target_const,void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  Handle_Info **HndInfo;
  int Mx_00;
  Handle_Info *local_30;
  
  iVar2 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar2 = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x810,"Inside UpnpSearchAsync\n");
    HandleReadLock((char *)0x812,iVar2);
    HndInfo = &local_30;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    iVar2 = (int)HndInfo;
    if (UVar1 == HND_CLIENT) {
      if (Target_const == (char *)0x0) {
        HandleUnlock((char *)0x81e,iVar2);
        iVar2 = -0x65;
      }
      else {
        Mx_00 = 5;
        if (0 < Mx) {
          Mx_00 = Mx;
        }
        HandleUnlock((char *)0x822,iVar2);
        iVar2 = SearchByTarget(Hnd,Mx_00,Target_const,Cookie_const);
        if (iVar2 == 1) {
          iVar2 = 0;
          UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x82a,"Exiting UpnpSearchAsync \n");
        }
      }
    }
    else {
      HandleUnlock((char *)0x817,iVar2);
      iVar2 = -100;
    }
  }
  return iVar2;
}

Assistant:

int UpnpSearchAsync(UpnpClient_Handle Hnd,
	int Mx,
	const char *Target_const,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	char *Target = (char *)Target_const;
	int retVal;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(
		UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSearchAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (Mx < 1)
		Mx = DEFAULT_MX;

	if (Target == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = SearchByTarget(Hnd, Mx, Target, (void *)Cookie_const);
	if (retVal != 1)
		return retVal;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSearchAsync \n");

	return UPNP_E_SUCCESS;
}